

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hawktracer.c
# Opt level: O1

void ht_task_scheduler_destroy(HT_TaskScheduler *task_scheduler)

{
  void *__ptr;
  ulong uVar1;
  
  if ((task_scheduler->tasks).size != 0) {
    uVar1 = 0;
    do {
      __ptr = (task_scheduler->tasks).data[uVar1];
      if (realloc_fnc_ == (realloc_function)0x0) {
        free(__ptr);
      }
      else {
        (*realloc_fnc_)(__ptr,0,user_data_);
      }
      uVar1 = uVar1 + 1;
    } while (uVar1 < (task_scheduler->tasks).size);
  }
  ht_bag_void_ptr_deinit(&task_scheduler->tasks);
  if (realloc_fnc_ != (realloc_function)0x0) {
    (*realloc_fnc_)(task_scheduler,0,user_data_);
    return;
  }
  free(task_scheduler);
  return;
}

Assistant:

void
ht_task_scheduler_destroy(HT_TaskScheduler* task_scheduler)
{
    size_t i = 0;
    for (i = 0; i < task_scheduler->tasks.size; i++)
    {
        ht_free(task_scheduler->tasks.data[i]);
    }

    ht_bag_void_ptr_deinit(&task_scheduler->tasks);
    ht_free(task_scheduler);
}